

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall
BuildStatus::BuildEdgeFinished
          (BuildStatus *this,Edge *edge,bool success,string *output,int *start_time,int *end_time)

{
  bool bVar1;
  pointer ppVar2;
  reference ppNVar3;
  string *__lhs;
  ulong uVar4;
  string local_1c0;
  undefined1 local_1a0 [8];
  string final_output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_90;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_88;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_80;
  const_iterator o;
  string outputs;
  iterator local_48;
  iterator i;
  int64_t now;
  int *end_time_local;
  int *start_time_local;
  string *output_local;
  Edge *pEStack_18;
  bool success_local;
  Edge *edge_local;
  BuildStatus *this_local;
  
  pEStack_18 = edge;
  edge_local = (Edge *)this;
  i._M_node = (_Base_ptr)GetTimeMillis();
  this->finished_edges_ = this->finished_edges_ + 1;
  local_48 = std::
             map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
             ::find(&this->running_edges_,&stack0xffffffffffffffe8);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_Edge_*const,_int>_>::operator->(&local_48);
  *start_time = ppVar2->second;
  *end_time = (int)i._M_node - (int)this->start_time_millis_;
  std::map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>::
  erase_abi_cxx11_((map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                    *)&this->running_edges_,local_48);
  bVar1 = Edge::use_console(pEStack_18);
  if (bVar1) {
    LinePrinter::SetConsoleLocked(&this->printer_,false);
  }
  if (*(int *)this->config_ != 1) {
    bVar1 = Edge::use_console(pEStack_18);
    if (!bVar1) {
      PrintStatus(this,pEStack_18,kEdgeFinished);
    }
    if (!success) {
      std::__cxx11::string::string((string *)&o);
      local_88._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&pEStack_18->outputs_);
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_80,&local_88);
      while( true ) {
        local_90._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&pEStack_18->outputs_);
        bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
        if (!bVar1) break;
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_80);
        __lhs = Node::path_abi_cxx11_(*ppNVar3);
        std::operator+(&local_b0,__lhs," ");
        std::__cxx11::string::operator+=((string *)&o,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_80);
      }
      bVar1 = LinePrinter::supports_color(&this->printer_);
      if (bVar1) {
        std::operator+(&local_100,"\x1b[31mFAILED: \x1b[0m",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        std::operator+(&local_e0,&local_100,"\n");
        LinePrinter::PrintOnNewLine(&this->printer_,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        std::operator+(&local_140,"FAILED: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        std::operator+(&local_120,&local_140,"\n");
        LinePrinter::PrintOnNewLine(&this->printer_,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
      }
      Edge::EvaluateCommand_abi_cxx11_((string *)((long)&final_output.field_2 + 8),pEStack_18,false)
      ;
      std::operator+(&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&final_output.field_2 + 8),"\n");
      LinePrinter::PrintOnNewLine(&this->printer_,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)(final_output.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&o);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string((string *)local_1a0);
      bVar1 = LinePrinter::supports_color(&this->printer_);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_1a0,(string *)output);
      }
      else {
        StripAnsiEscapeCodes(&local_1c0,output);
        std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      LinePrinter::PrintOnNewLine(&this->printer_,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  return;
}

Assistant:

void BuildStatus::BuildEdgeFinished(Edge* edge,
                                    bool success,
                                    const string& output,
                                    int* start_time,
                                    int* end_time) {
  int64_t now = GetTimeMillis();

  ++finished_edges_;

  RunningEdgeMap::iterator i = running_edges_.find(edge);
  *start_time = i->second;
  *end_time = (int)(now - start_time_millis_);
  running_edges_.erase(i);

  if (edge->use_console())
    printer_.SetConsoleLocked(false);

  if (config_.verbosity == BuildConfig::QUIET)
    return;

  if (!edge->use_console())
    PrintStatus(edge, kEdgeFinished);

  // Print the command that is spewing before printing its output.
  if (!success) {
    string outputs;
    for (vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o)
      outputs += (*o)->path() + " ";

    if (printer_.supports_color()) {
        printer_.PrintOnNewLine("\x1B[31m" "FAILED: " "\x1B[0m" + outputs + "\n");
    } else {
        printer_.PrintOnNewLine("FAILED: " + outputs + "\n");
    }
    printer_.PrintOnNewLine(edge->EvaluateCommand() + "\n");
  }

  if (!output.empty()) {
    // ninja sets stdout and stderr of subprocesses to a pipe, to be able to
    // check if the output is empty. Some compilers, e.g. clang, check
    // isatty(stderr) to decide if they should print colored output.
    // To make it possible to use colored output with ninja, subprocesses should
    // be run with a flag that forces them to always print color escape codes.
    // To make sure these escape codes don't show up in a file if ninja's output
    // is piped to a file, ninja strips ansi escape codes again if it's not
    // writing to a |smart_terminal_|.
    // (Launching subprocesses in pseudo ttys doesn't work because there are
    // only a few hundred available on some systems, and ninja can launch
    // thousands of parallel compile commands.)
    string final_output;
    if (!printer_.supports_color())
      final_output = StripAnsiEscapeCodes(output);
    else
      final_output = output;

#ifdef _WIN32
    // Fix extra CR being added on Windows, writing out CR CR LF (#773)
    _setmode(_fileno(stdout), _O_BINARY);  // Begin Windows extra CR fix
#endif

    printer_.PrintOnNewLine(final_output);

#ifdef _WIN32
    _setmode(_fileno(stdout), _O_TEXT);  // End Windows extra CR fix
#endif
  }
}